

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

FILE * getiofile(lua_State *L,int findex)

{
  long *plVar1;
  
  lua_rawgeti(L,-0x2711,findex);
  plVar1 = (long *)lua_touserdata(L,-1);
  if ((FILE *)*plVar1 != (FILE *)0x0) {
    return (FILE *)*plVar1;
  }
  luaL_error(L,"standard %s file is closed",
             (long)&fnames_rel + (long)*(int *)((long)&fnames_rel + (ulong)(findex - 1) * 4));
}

Assistant:

static FILE*getiofile(lua_State*L,int findex){
FILE*f;
lua_rawgeti(L,(-10001),findex);
f=*(FILE**)lua_touserdata(L,-1);
if(f==NULL)
luaL_error(L,"standard %s file is closed",fnames[findex-1]);
return f;
}